

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::type_to_location_count(CompilerGLSL *this,SPIRType *type)

{
  uint32_t uVar1;
  uint32_t uVar2;
  SPIRType *type_00;
  uint32_t uVar3;
  ulong uVar4;
  uint32_t index;
  ulong uVar5;
  
  if (type->basetype == Struct) {
    uVar5 = (ulong)(uint)(type->member_types).
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                         .buffer_size;
    if (uVar5 == 0) {
      uVar3 = 0;
    }
    else {
      uVar4 = 0;
      uVar3 = 0;
      do {
        type_00 = Variant::get<diligent_spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             (type->member_types).
                             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                             .ptr[uVar4].id);
        uVar1 = type_to_location_count(this,type_00);
        uVar3 = uVar3 + uVar1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  else {
    uVar3 = type->columns + (uint)(type->columns == 0);
  }
  uVar1 = (uint32_t)(type->array).super_VectorView<unsigned_int>.buffer_size;
  if (uVar1 != 0) {
    index = 0;
    do {
      uVar2 = to_array_size_literal(this,type,index);
      uVar3 = uVar3 * uVar2;
      index = index + 1;
    } while (uVar1 != index);
  }
  return uVar3;
}

Assistant:

uint32_t CompilerGLSL::type_to_location_count(const SPIRType &type) const
{
	uint32_t count;
	if (type.basetype == SPIRType::Struct)
	{
		uint32_t mbr_count = uint32_t(type.member_types.size());
		count = 0;
		for (uint32_t i = 0; i < mbr_count; i++)
			count += type_to_location_count(get<SPIRType>(type.member_types[i]));
	}
	else
	{
		count = type.columns > 1 ? type.columns : 1;
	}

	uint32_t dim_count = uint32_t(type.array.size());
	for (uint32_t i = 0; i < dim_count; i++)
		count *= to_array_size_literal(type, i);

	return count;
}